

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void notch::core::SGD::train
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Net *net,LabeledDataset *trainSet,int epochs,EpochCallback *epochCallback,
               IterationCallback *sampleCallback)

{
  pointer pvVar1;
  element_type *peVar2;
  LabeledDataset *pLVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Array *pAVar7;
  undefined4 extraout_var;
  pointer pvVar8;
  Array *inputs;
  int currentEpoch;
  byte bVar9;
  int currentIteration;
  LabeledDataset *__range3;
  int local_5c;
  EpochCallback *local_58;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *local_50;
  LabeledDataset *local_48;
  IterationCallback *local_40;
  Array *local_38;
  
  local_50 = rng;
  local_48 = trainSet;
  local_40 = sampleCallback;
  if (0 < epochs) {
    currentEpoch = 0;
    local_58 = epochCallback;
    do {
      bVar4 = EpochCallback::operator()(local_58,currentEpoch,false);
      pLVar3 = local_48;
      if (bVar4) {
        return;
      }
      LabeledDataset::shuffle(local_48,local_50);
      inputs = (pLVar3->inputs).
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_38 = (pLVar3->inputs).
                 super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pvVar8 = (pLVar3->outputs).
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pvVar1 = (pLVar3->outputs).
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar4 = inputs == local_38;
      if (!bVar4 || pvVar8 != pvVar1) {
        currentIteration = 0;
        do {
          pAVar7 = Net::output(net,inputs);
          peVar2 = (net->lossLayer).
                   super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar2->_vptr_ALossLayer[1])(peVar2,pAVar7,pvVar8);
          Net::selfCheck(net);
          iVar6 = (*((net->lossLayer).
                     super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->_vptr_ALossLayer[2])();
          Net::backprop(net,(Array *)CONCAT44(extraout_var,iVar6));
          Net::update(net);
          bVar5 = IterationCallback::operator()(local_40,currentIteration,false);
          if (bVar5) {
            return;
          }
          currentIteration = currentIteration + 1;
          bVar9 = ~bVar4 & pvVar8 != pvVar1;
          inputs = inputs + bVar9;
          pvVar8 = pvVar8 + bVar9;
          bVar4 = inputs == local_38;
        } while (pvVar8 != pvVar1 || !bVar4);
      }
      currentEpoch = currentEpoch + 1;
      epochCallback = local_58;
    } while (currentEpoch != epochs);
  }
  local_5c = epochs;
  if ((epochCallback->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(epochCallback->callback)._M_invoker)((_Any_data *)&epochCallback->callback,&local_5c);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

static
    void train(std::unique_ptr<RNG> &rng,
            Net &net, LabeledDataset &trainSet, int epochs,
            const EpochCallback &epochCallback = noEpochCallback,
            const IterationCallback &sampleCallback = noIterationCallback) {
        for (int j = 0; j < epochs; ++j) {
            if (epochCallback(j)) {
                return;
            }
            trainSet.shuffle(rng);
            int sampleCounter = 0;
            for (auto sample : trainSet) {
                net.loss(sample.data, sample.label);
                net.backprop();
                net.update();
                if (sampleCallback(sampleCounter)) {
                    return;
                }
                ++sampleCounter;
            }
        }
        epochCallback(epochs, true);
    }